

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Error ps_table_realloc(PS_Table table,FT_Offset new_size)

{
  FT_Byte **ppFVar1;
  FT_Byte *block;
  undefined8 in_RAX;
  FT_Byte *pFVar2;
  FT_Byte **ppFVar3;
  FT_Error error;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  block = table->block;
  pFVar2 = (FT_Byte *)ft_mem_realloc(table->memory,1,table->capacity,new_size,block,&local_24);
  table->block = pFVar2;
  if (local_24 == 0) {
    if ((pFVar2 != block && block != (FT_Byte *)0x0) && (0 < (long)table->max_elems)) {
      ppFVar3 = table->elements;
      ppFVar1 = ppFVar3 + table->max_elems;
      do {
        if (*ppFVar3 != (FT_Byte *)0x0) {
          *ppFVar3 = *ppFVar3 + ((long)table->block - (long)block);
        }
        ppFVar3 = ppFVar3 + 1;
      } while (ppFVar3 < ppFVar1);
    }
    table->capacity = new_size;
    local_24 = 0;
  }
  return local_24;
}

Assistant:

static FT_Error
  ps_table_realloc( PS_Table   table,
                    FT_Offset  new_size )
  {
    FT_Memory  memory   = table->memory;
    FT_Byte*   old_base = table->block;
    FT_Error   error;


    /* (re)allocate the base block */
    if ( FT_REALLOC( table->block, table->capacity, new_size ) )
      return error;

    /* rebase offsets if necessary */
    if ( old_base && table->block != old_base )
    {
      FT_Byte**   offset = table->elements;
      FT_Byte**   limit  = offset + table->max_elems;


      for ( ; offset < limit; offset++ )
      {
        if ( *offset )
          *offset = table->block + ( *offset - old_base );
      }
    }

    table->capacity = new_size;

    return FT_Err_Ok;
  }